

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_application_filter.cpp
# Opt level: O3

bool __thiscall Fossilize::ApplicationInfoFilter::Impl::parse(Impl *this,char *path)

{
  bool bVar1;
  SizeType SVar2;
  int iVar3;
  FILE *__stream;
  size_type __n;
  size_t sVar4;
  Value *pVVar5;
  Ch *pCVar6;
  undefined8 str;
  undefined8 uVar7;
  undefined8 *puVar8;
  string json_str;
  Data local_d8;
  long local_c8 [2];
  undefined1 *local_b8;
  undefined8 local_b0;
  undefined1 local_a8;
  undefined7 uStack_a7;
  Data local_98;
  undefined8 *local_88;
  undefined8 *puStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 local_50;
  int local_48;
  undefined8 local_40;
  
  __stream = fopen(path,"rb");
  str = 0;
  uVar7 = (Ch *)0x0;
  puVar8 = (undefined8 *)0;
  if (__stream != (FILE *)0x0) {
    fseek(__stream,0,2);
    __n = ftell(__stream);
    if ((long)__n < 0) {
      fclose(__stream);
LAB_001406dc:
      str = 0;
      uVar7 = (Ch *)0x0;
      puVar8 = (undefined8 *)0;
    }
    else {
      rewind(__stream);
      std::vector<char,_std::allocator<char>_>::vector
                ((vector<char,_std::allocator<char>_> *)&local_98.s,__n,
                 (allocator_type *)&local_d8.s);
      sVar4 = fread((void *)local_98.n,1,__n,__stream);
      fclose(__stream);
      str = local_98.n;
      uVar7 = local_98.s.str;
      puVar8 = local_88;
      if (sVar4 != __n) {
        str = 0;
        uVar7 = (Ch *)0x0;
        puVar8 = (undefined8 *)0;
        if (local_98.n.i64 != 0) {
          operator_delete((void *)local_98.n,(long)local_88 - local_98._0_8_);
          goto LAB_001406dc;
        }
      }
    }
  }
  local_68 = 0;
  uStack_60 = 0;
  local_78 = 0;
  uStack_70 = 0;
  local_88 = (undefined8 *)0x0;
  puStack_80 = (undefined8 *)0x0;
  local_98.n = (Number)0x0;
  local_98.s.str = (Ch *)0x0;
  bVar1 = false;
  local_58 = 0;
  local_50 = 0x400;
  local_48 = 0;
  local_40 = 0;
  local_88 = (undefined8 *)operator_new(0x28);
  *local_88 = 0;
  local_88[1] = 0x10000;
  local_88[2] = 0;
  local_88[3] = 0;
  local_88[4] = 0;
  puStack_80 = local_88;
  rapidjson::
  GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>
  ::Parse<0u,rapidjson::UTF8<char>>
            ((GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>
              *)&local_98.s,(Ch *)str,uVar7 - str);
  if (local_48 != 0) goto LAB_00140a97;
  local_b8 = &local_a8;
  local_b0 = 0;
  local_a8 = 0;
  pVVar5 = get_safe_member((Value *)&local_98.s,"asset");
  if ((pVVar5 == (Value *)0x0) ||
     ((undefined1  [16])((undefined1  [16])pVVar5->data_ & (undefined1  [16])0x400000000000000) ==
      (undefined1  [16])0x0)) {
    parse();
    goto LAB_00140a6e;
  }
  pCVar6 = rapidjson::
           GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
           ::GetString(pVVar5);
  SVar2 = rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::GetStringLength(pVVar5);
  local_d8.n = (Number)local_c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,pCVar6,pCVar6 + SVar2);
  std::__cxx11::string::operator=((string *)&local_b8,(string *)&local_d8.s);
  if (local_d8.n.i64 != (Number)local_c8) {
    operator_delete((void *)local_d8.n,local_c8[0] + 1);
  }
  iVar3 = std::__cxx11::string::compare((char *)&local_b8);
  if (iVar3 == 0) {
    pVVar5 = get_safe_member((Value *)&local_98.s,"version");
    if ((pVVar5 == (Value *)0x0) ||
       ((undefined1  [16])((undefined1  [16])pVVar5->data_ & (undefined1  [16])0x20000000000000) ==
        (undefined1  [16])0x0)) {
      parse();
      goto LAB_00140a78;
    }
    if (2 < (int)(pVVar5->data_).s.length) goto LAB_00140a78;
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    FindMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                *)&local_d8.s,(Ch *)&local_98);
    if (local_98.f.flags != 3) {
LAB_00140ac9:
      __assert_fail("IsObject()",
                    "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/rapidjson/include/rapidjson/document.h"
                    ,0x4db,
                    "ConstMemberIterator rapidjson::GenericValue<rapidjson::UTF8<>>::MemberEnd() const [Encoding = rapidjson::UTF8<>, Allocator = rapidjson::MemoryPoolAllocator<>]"
                   );
    }
    if ((local_d8.n.i64 !=
         (Number)(((ulong)local_98.n & 0xffffffff) * 0x20 + ((ulong)local_98.s.str & 0xffffffffffff)
                 )) &&
       (bVar1 = add_blacklists(&this->blacklisted_application_names,
                               (Value *)((long)local_d8.n + 0x10)), !bVar1)) goto LAB_00140a78;
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    FindMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                *)&local_d8.s,(Ch *)&local_98);
    if (local_98.f.flags != 3) goto LAB_00140ac9;
    if ((local_d8.n.i64 ==
         (Number)(((ulong)local_98.n & 0xffffffff) * 0x20 + ((ulong)local_98.s.str & 0xffffffffffff)
                 )) ||
       (bVar1 = add_blacklists(&this->blacklisted_engine_names,(Value *)((long)local_d8.n + 0x10)),
       bVar1)) {
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::FindMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                    *)&local_d8.s,(Ch *)&local_98);
      if (local_98.f.flags != 3) goto LAB_00140ac9;
      if ((local_d8.n.i64 !=
           (Number)(((ulong)local_98.n & 0xffffffff) * 0x20 +
                   ((ulong)local_98.s.str & 0xffffffffffff))) &&
         (bVar1 = add_application_filters
                            (&this->application_infos,(Value *)((long)local_d8.n + 0x10)), !bVar1))
      goto LAB_00140a6e;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::FindMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                    *)&local_d8.s,(Ch *)&local_98);
      if (local_98.f.flags != 3) goto LAB_00140ac9;
      if ((((local_d8.n.i64 !=
             (Number)(((ulong)local_98.n & 0xffffffff) * 0x20 +
                     ((ulong)local_98.s.str & 0xffffffffffff))) &&
           (bVar1 = add_application_filters(&this->engine_infos,(Value *)((long)local_d8.n + 0x10)),
           !bVar1)) ||
          ((pVVar5 = maybe_get_member((Value *)&local_98.s,"defaultBucketVariantDependencies"),
           pVVar5 != (Value *)0x0 &&
           (bVar1 = parse_bucket_variant_dependencies(pVVar5,&this->default_variant_dependencies),
           !bVar1)))) ||
         ((pVVar5 = maybe_get_member((Value *)&local_98.s,"defaultBucketVariantFeatureDependencies")
          , pVVar5 != (Value *)0x0 &&
          (bVar1 = parse_bucket_variant_dependencies
                             (pVVar5,&this->default_variant_dependencies_feature), !bVar1))))
      goto LAB_00140a6e;
      bVar1 = true;
    }
    else {
LAB_00140a6e:
      bVar1 = false;
    }
  }
  else {
LAB_00140a78:
    bVar1 = false;
  }
  if (local_b8 != &local_a8) {
    operator_delete(local_b8,CONCAT71(uStack_a7,local_a8) + 1);
  }
LAB_00140a97:
  rapidjson::
  GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
  ::~GenericDocument((GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                      *)&local_98.s);
  if ((Ch *)str != (Ch *)0x0) {
    operator_delete((void *)str,(long)puVar8 - str);
  }
  return bVar1;
}

Assistant:

bool ApplicationInfoFilter::Impl::parse(const char *path)
{
	auto buffer = read_file(path);

	Document doc;
	doc.Parse(buffer.data(), buffer.size());
	if (doc.HasParseError())
		return false;

	std::string json_str;
	int json_int;

	if (!get_safe_member_string(doc, "asset", json_str) || json_str != "FossilizeApplicationInfoFilter")
		return false;

	if (!get_safe_member_int(doc, "version", json_int) || json_int > FOSSILIZE_APPLICATION_INFO_FILTER_VERSION)
		return false;

	auto *blacklist = maybe_get_member(doc, "blacklistedApplicationNames");
	if (blacklist)
		if (!add_blacklists(blacklisted_application_names, blacklist))
			return false;
	blacklist = maybe_get_member(doc, "blacklistedEngineNames");
	if (blacklist)
		if (!add_blacklists(blacklisted_engine_names, blacklist))
			return false;

	auto *filters = maybe_get_member(doc, "applicationFilters");
	if (filters)
		if (!add_application_filters(application_infos, filters))
			return false;
	filters = maybe_get_member(doc, "engineFilters");
	if (filters)
		if (!add_application_filters(engine_infos, filters))
			return false;

	auto *default_variants = maybe_get_member(doc, "defaultBucketVariantDependencies");
	if (default_variants)
		if (!parse_bucket_variant_dependencies(*default_variants, default_variant_dependencies))
			return false;

	auto *default_feature_variants = maybe_get_member(doc, "defaultBucketVariantFeatureDependencies");
	if (default_feature_variants)
		if (!parse_bucket_variant_dependencies(*default_feature_variants, default_variant_dependencies_feature))
			return false;

	return true;
}